

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

void do_fix_all(Am_Value_List *list,Am_Object *inter)

{
  bool bVar1;
  Am_Value *in_value;
  char *s;
  Am_Wrapper *value;
  Am_Input_Char ic;
  Am_String str;
  Am_Value item;
  Am_Value_List new_list;
  Am_Value local_40;
  
  Am_Value_List::Am_Value_List(&new_list);
  item.type = 0;
  item.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Input_Char::Am_Input_Char(&ic,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  str.data = (Am_String_Data *)0x0;
  Am_Value_List::Start(list);
  while( true ) {
    bVar1 = Am_Value_List::Last(list);
    if (bVar1) break;
    in_value = Am_Value_List::Get(list);
    Am_Value::operator=(&item,in_value);
    if (item.type == 0x8008) {
      Am_String::Am_String((Am_String *)&local_40,&item);
      s = Am_String::operator_cast_to_char_((Am_String *)&local_40);
      Am_String::~Am_String((Am_String *)&local_40);
      Am_Input_Char::Am_Input_Char((Am_Input_Char *)&local_40,s,true);
      Am_Input_Char::operator=(&ic,(Am_Input_Char *)&local_40);
    }
    else {
      Am_Input_Char::operator=(&ic,&item);
    }
    Am_Input_Char::operator_cast_to_Am_Value(&ic);
    Am_Value_List::Add(&new_list,&local_40,Am_TAIL,true);
    Am_Value::~Am_Value(&local_40);
    Am_Value_List::Next(list);
  }
  value = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_list);
  Am_Object::Set(inter,0x196,value,0x10000);
  Am_Value_List::operator=(list,&new_list);
  Am_String::~Am_String(&str);
  Am_Value::~Am_Value(&item);
  Am_Value_List::~Am_Value_List(&new_list);
  return;
}

Assistant:

void
do_fix_all(Am_Value_List &list, Am_Object &inter)
{
  Am_Value_List new_list;
  Am_Value item;
  Am_Input_Char ic;
  Am_String str;
  for (list.Start(); !list.Last(); list.Next()) {
    item = list.Get();
    if (item.type == Am_STRING) {
      const char *str = (Am_String)item;
      ic = Am_Input_Char(str);
    } else
      ic = item;
    new_list.Add(ic);
  }
  inter.Set(Am_SELECTION_MOVE_CHARS, new_list, Am_KEEP_FORMULAS);
  list = new_list;
}